

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O0

string * __thiscall
libcellml::XmlAttribute::value_abi_cxx11_(string *__return_storage_ptr__,XmlAttribute *this)

{
  xmlAttrPtr pxVar1;
  char *__s;
  allocator<char> local_59;
  string local_58 [48];
  char *local_28;
  xmlChar *value;
  XmlAttribute *local_18;
  XmlAttribute *this_local;
  string *valueString;
  
  value._7_1_ = 0;
  local_18 = this;
  this_local = (XmlAttribute *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pxVar1 = this->mPimpl->mXmlAttributePtr;
  __s = (char *)xmlGetProp(pxVar1->parent,pxVar1->name);
  local_28 = __s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,__s,&local_59);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  (*_xmlFree)(local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlAttribute::value() const
{
    std::string valueString;
    xmlChar *value = xmlGetProp(mPimpl->mXmlAttributePtr->parent, mPimpl->mXmlAttributePtr->name);
    valueString = std::string(reinterpret_cast<const char *>(value));
    xmlFree(value);
    return valueString;
}